

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

void __thiscall duckdb::BaseStatistics::BaseStatistics(BaseStatistics *this,BaseStatistics *other)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  LogicalType::LogicalType(&this->type);
  (this->child_stats).
  super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  ::std::swap<duckdb::LogicalType>(&this->type,&other->type);
  this->has_null = other->has_null;
  this->has_no_null = other->has_no_null;
  this->distinct_count = other->distinct_count;
  uVar1 = *(undefined8 *)((long)&other->stats_union + 8);
  uVar2 = *(undefined8 *)((long)&other->stats_union + 0x10);
  uVar3 = *(undefined8 *)((long)&other->stats_union + 0x18);
  *(undefined8 *)(this->stats_union).string_data.min =
       *(undefined8 *)(other->stats_union).string_data.min;
  *(undefined8 *)((long)&this->stats_union + 8) = uVar1;
  *(undefined8 *)((long)&this->stats_union + 0x10) = uVar2;
  *(undefined8 *)((long)&this->stats_union + 0x18) = uVar3;
  *(undefined8 *)((long)&this->stats_union + 0x20) =
       *(undefined8 *)((long)&other->stats_union + 0x20);
  ::std::
  swap<duckdb::unique_ptr<duckdb::BaseStatistics[],std::default_delete<duckdb::BaseStatistics>,false>>
            (&this->child_stats,&other->child_stats);
  return;
}

Assistant:

BaseStatistics::BaseStatistics(BaseStatistics &&other) noexcept {
	std::swap(type, other.type);
	has_null = other.has_null;
	has_no_null = other.has_no_null;
	distinct_count = other.distinct_count;
	stats_union = other.stats_union;
	std::swap(child_stats, other.child_stats);
}